

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall Js::SmallSpanSequence::Cleanup(SmallSpanSequence *this)

{
  SmallSpanSequence *this_local;
  
  if (this->pStatementBuffer != (GrowingUint32HeapArray *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::GrowingArray<unsigned_int,Memory::HeapAllocator>>
              (&Memory::HeapAllocator::Instance,this->pStatementBuffer);
    this->pStatementBuffer = (GrowingUint32HeapArray *)0x0;
  }
  if (this->pActualOffsetList != (GrowingUint32HeapArray *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::GrowingArray<unsigned_int,Memory::HeapAllocator>>
              (&Memory::HeapAllocator::Instance,this->pActualOffsetList);
    this->pActualOffsetList = (GrowingUint32HeapArray *)0x0;
  }
  return;
}

Assistant:

void Cleanup()
        {
            if (pStatementBuffer != nullptr)
            {
                HeapDelete(pStatementBuffer);
                pStatementBuffer = nullptr;
            }

            if (pActualOffsetList != nullptr)
            {
                HeapDelete(pActualOffsetList);
                pActualOffsetList = nullptr;
            }
        }